

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
ctemplate::BaseArena::GetMemoryFallback(BaseArena *this,size_t size,int align_as_int)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  AllocatedBlock *pAVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (size == 0) {
    return (void *)0x0;
  }
  if (0 < align_as_int) {
    uVar3 = (ulong)align_as_int;
    uVar1 = uVar3 - 1;
    if ((uVar3 & uVar1) == 0) {
      if (this->block_size_ >> 2 < size) {
        if ((uint)align_as_int < 9) {
          pAVar4 = AllocNewBlock(this,size);
          return pAVar4->mem;
        }
        __assert_fail("align <= kDefaultAlignment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                      ,0x116,
                      "void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
      }
      uVar5 = uVar1 & (ulong)this->freestart_;
      if (uVar5 != 0) {
        uVar3 = uVar3 - uVar5;
        this->freestart_ = this->freestart_ + uVar3;
        sVar6 = 0;
        if (uVar3 <= this->remaining_) {
          sVar6 = this->remaining_ - uVar3;
        }
        this->remaining_ = sVar6;
      }
      if (this->remaining_ < size) {
        pAVar4 = AllocNewBlock(this,this->block_size_);
        this->freestart_ = pAVar4->mem;
        this->remaining_ = pAVar4->size;
      }
      this->remaining_ = this->remaining_ - size;
      pcVar2 = this->freestart_;
      this->last_alloc_ = pcVar2;
      this->freestart_ = pcVar2 + size;
      if ((uVar1 & (ulong)pcVar2) == 0) {
        return pcVar2;
      }
      __assert_fail("0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                    ,0x12d,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)")
      ;
    }
  }
  __assert_fail("align_as_int > 0 && 0 == (align & (align - 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                ,0x110,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
}

Assistant:

void* BaseArena::GetMemoryFallback(const size_t size, const int align_as_int) {
  if (0 == size) {
    return NULL;             // stl/stl_alloc.h says this is okay
  }
  // This makes the type-checker happy.
  const size_t align = static_cast<size_t>(align_as_int);

  assert(align_as_int > 0 && 0 == (align & (align - 1))); // must be power of 2

  // If the object is more than a quarter of the block size, allocate
  // it separately to avoid wasting too much space in leftover bytes
  if (block_size_ == 0 || size > block_size_/4) {
    // then it gets its own block in the arena
    assert(align <= kDefaultAlignment);   // because that's what new gives us
    // This block stays separate from the rest of the world; in particular
    // we don't update last_alloc_ so you can't reclaim space on this block.
    return AllocNewBlock(size)->mem;
  }

  const size_t overage =
    (reinterpret_cast<uintptr_t>(freestart_) & (align-1));
  if (overage) {
    const size_t waste = align - overage;
    freestart_ += waste;
    if (waste < remaining_) {
      remaining_ -= waste;
    } else {
      remaining_ = 0;
    }
  }
  if (size > remaining_) {
    MakeNewBlock();
  }
  remaining_ -= size;
  last_alloc_ = freestart_;
  freestart_ += size;
  assert(0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1)));
  return reinterpret_cast<void*>(last_alloc_);
}